

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall
QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
::reset(QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
        *this,ProgressData *other)

{
  ProgressData *pPVar1;
  Data *pDVar2;
  ProgressData *__old_val;
  
  pPVar1 = this->d;
  if ((pPVar1 != other) && (this->d = other, pPVar1 != (ProgressData *)0x0)) {
    pDVar2 = (pPVar1->text).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pPVar1->text).d.d)->super_QArrayData,2,0x10);
      }
    }
    operator_delete(pPVar1,0x20);
    return;
  }
  return;
}

Assistant:

void reset(T *other = nullptr) noexcept(noexcept(Cleanup::cleanup(std::declval<T *>())))
    {
        if (d == other)
            return;
        T *oldD = std::exchange(d, other);
        Cleanup::cleanup(oldD);
    }